

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_node.cpp
# Opt level: O0

void __thiscall
DoubleNode::Act(DoubleNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  stack<double,_std::deque<double,_std::allocator<double>_>_> *s_local;
  DoubleNode *this_local;
  
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push(s,&this->value_);
  return;
}

Assistant:

void DoubleNode::Act(std::stack<double> &s) const {
  s.push(value_);
}